

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe7At3(uint8_t *buf)

{
  return (ulong)((uint)(buf[1] >> 6) + (*buf & 0x1f) * 4);
}

Assistant:

std::uint64_t readFlUIntBe7At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 2;
    res |= (buf[1] >> 6);
    res &= UINT64_C(0x7f);
    return res;
}